

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

bool woff2::TransformGlyfAndLocaTables(Font *font)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  pointer puVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  undefined1 auVar8 [12];
  byte bVar9;
  bool bVar10;
  int iVar12;
  const_iterator __begin2;
  bool bVar11;
  Table *pTVar13;
  Table *this;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  ulong uVar16;
  pointer pvVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  const_iterator __end2;
  Point *point;
  pointer pPVar22;
  byte bVar23;
  uint uVar24;
  int iVar25;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  long lVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  short sVar33;
  undefined8 extraout_XMM1_Qa;
  short sVar31;
  short sVar32;
  int iVar34;
  undefined1 in_XMM1 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar43;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar44;
  byte local_19d;
  int local_19c;
  Glyph glyph;
  GlyfEncoder encoder;
  size_t glyph_size;
  uint8_t *glyph_data;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  pTVar13 = Font::FindTable(font,0x676c7966);
  this = Font::FindTable(font,0x6c6f6361);
  bVar10 = true;
  if (pTVar13 != (Table *)0x0 || this != (Table *)0x0) {
    if ((this == (Table *)0x0) == (pTVar13 == (Table *)0x0)) {
      bVar10 = Font::Table::IsReused(this);
      bVar11 = Font::Table::IsReused(pTVar13);
      if (bVar10 == bVar11) {
        bVar10 = Font::Table::IsReused(this);
        if (bVar10) {
          return true;
        }
        encoder.n_contour_stream_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xe7ecf9e6;
        pmVar14 = std::
                  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                  ::operator[](&font->tables,(key_type *)&encoder);
        encoder.n_contour_stream_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = -0x13101c1f;
        pmVar15 = std::
                  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                  ::operator[](&font->tables,(key_type *)&encoder);
        iVar12 = NumGlyphs(font);
        memset(&encoder,0,0xc0);
        encoder.n_glyphs_ = iVar12;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&encoder.bbox_bitmap_,(long)(int)(iVar12 + 0x1f >> 3 & 0xfffffffc));
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        iVar25 = 0;
        do {
          if (iVar25 == iVar12) {
            out = &pmVar14->buffer;
            anon_unknown_2::WriteLong(out,0);
            anon_unknown_2::WriteUShort(out,encoder.n_glyphs_);
            anon_unknown_2::WriteUShort(out,0);
            anon_unknown_2::WriteLong
                      (out,(int)encoder.n_contour_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)encoder.n_contour_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            anon_unknown_2::WriteLong
                      (out,(int)encoder.n_points_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)encoder.n_points_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            anon_unknown_2::WriteLong
                      (out,(int)encoder.flag_byte_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)encoder.flag_byte_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            anon_unknown_2::WriteLong
                      (out,(int)encoder.glyph_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)encoder.glyph_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            anon_unknown_2::WriteLong
                      (out,(int)encoder.composite_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)encoder.composite_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            anon_unknown_2::WriteLong
                      (out,((int)encoder.bbox_bitmap_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish +
                           (int)encoder.bbox_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish) -
                           ((int)encoder.bbox_bitmap_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                           (int)encoder.bbox_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start));
            anon_unknown_2::WriteLong
                      (out,(int)encoder.instruction_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)encoder.instruction_stream_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            anon_unknown_2::WriteBytes(out,&encoder.n_contour_stream_);
            anon_unknown_2::WriteBytes(out,&encoder.n_points_stream_);
            anon_unknown_2::WriteBytes(out,&encoder.flag_byte_stream_);
            anon_unknown_2::WriteBytes(out,&encoder.glyph_stream_);
            anon_unknown_2::WriteBytes(out,&encoder.composite_stream_);
            anon_unknown_2::WriteBytes(out,&encoder.bbox_bitmap_);
            anon_unknown_2::WriteBytes(out,&encoder.bbox_stream_);
            anon_unknown_2::WriteBytes(out,&encoder.instruction_stream_);
            pTVar13 = Font::FindTable(font,0x68656164);
            if ((pTVar13 == (Table *)0x0) || (pTVar13->length < 0x34)) {
LAB_0010de37:
              bVar10 = false;
            }
            else {
              (pmVar14->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[7] = pTVar13->data[0x33];
              pmVar14->tag = 0xe7ecf9e6;
              puVar4 = (pmVar14->buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pmVar14->length =
                   *(int *)&(pmVar14->buffer).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (int)puVar4;
              pmVar14->data = puVar4;
              pmVar15->tag = 0xecefe3e1;
              pmVar15->length = 0;
              pmVar15->data = (uint8_t *)0x0;
              bVar10 = true;
            }
            anon_unknown_2::GlyfEncoder::~GlyfEncoder(&encoder);
            return bVar10;
          }
          glyph.instructions_size = 0;
          glyph.contours.
          super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          glyph.contours.
          super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          glyph.contours.
          super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          glyph.composite_data_size = 0;
          local_19c = iVar25;
          bVar10 = GetGlyphData(font,iVar25,&glyph_data,&glyph_size);
          if ((!bVar10) ||
             ((glyph_size != 0 && (bVar10 = ReadGlyph(glyph_data,glyph_size,&glyph), !bVar10)))) {
            std::
            vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ::~vector(&glyph.contours);
            goto LAB_0010de37;
          }
          if (glyph.composite_data_size == 0) {
            if ((long)glyph.contours.
                      super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)glyph.contours.
                      super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0) {
              anon_unknown_2::WriteUShort(&encoder.n_contour_stream_,0);
            }
            else {
              uVar16 = ((long)glyph.contours.
                              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)glyph.contours.
                             super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
              iVar25 = (int)uVar16;
              anon_unknown_2::WriteUShort(&encoder.n_contour_stream_,iVar25);
              if ((glyph.contours.
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   glyph.contours.
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) ||
                 (pPVar22 = ((glyph.contours.
                              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                 pPVar22 ==
                 ((glyph.contours.
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>).
                 _M_impl.super__Vector_impl_data._M_finish)) {
                if (glyph._0_8_ != 0) goto LAB_0010da43;
              }
              else {
                uVar1 = pPVar22->x;
                uVar2 = pPVar22->y;
                auVar28._4_4_ = uVar2;
                auVar28._0_4_ = uVar1;
                auVar28._8_8_ = 0;
                auVar28 = pshuflw(auVar28,auVar28,0xa0);
                for (pvVar17 = glyph.contours.
                               super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pvVar17 !=
                    glyph.contours.
                    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pvVar17 = pvVar17 + 1) {
                  for (pPVar22 = (pvVar17->
                                 super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                      pPVar22 !=
                      (pvVar17->
                      super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>)
                      ._M_impl.super__Vector_impl_data._M_finish; pPVar22 = pPVar22 + 1) {
                    auVar29._0_12_ = in_XMM1._0_12_;
                    auVar29._12_2_ = in_XMM1._6_2_;
                    auVar29._14_2_ = auVar28._6_2_;
                    auVar38._12_4_ = auVar29._12_4_;
                    auVar38._0_10_ = in_XMM1._0_10_;
                    auVar38._10_2_ = auVar28._4_2_;
                    auVar36._10_6_ = auVar38._10_6_;
                    auVar36._0_8_ = in_XMM1._0_8_;
                    auVar36._8_2_ = in_XMM1._4_2_;
                    auVar8._4_8_ = auVar36._8_8_;
                    auVar8._2_2_ = auVar28._2_2_;
                    auVar8._0_2_ = in_XMM1._2_2_;
                    iVar34 = auVar36._8_4_ >> 0x10;
                    uVar18._0_4_ = pPVar22->x;
                    uVar18._4_4_ = pPVar22->y;
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = uVar18;
                    auVar36 = pshuflw(auVar35,auVar35,0xa0);
                    iVar44 = -(uint)((int)uVar18._4_4_ < iVar34);
                    iVar43 = -(uint)(auVar38._12_4_ >> 0x10 < (int)uVar18._4_4_);
                    auVar30._4_4_ = -(uint)(auVar8._0_4_ >> 0x10 < (int)(undefined4)uVar18);
                    auVar30._0_4_ = iVar43;
                    auVar30._8_4_ = -(uint)(iVar34 < (int)uVar18._4_4_);
                    auVar30._12_4_ = iVar43;
                    in_XMM1 = pshuflw(auVar30,auVar30,0xe2);
                    auVar37._4_4_ = iVar44;
                    auVar37._0_4_ = -(uint)((int)(undefined4)uVar18 < (int)auVar28._0_2_);
                    auVar37._8_4_ = iVar44;
                    auVar37._12_4_ = -(uint)((int)uVar18._4_4_ < auVar38._12_4_ >> 0x10);
                    auVar38 = pshuflw(auVar37,auVar37,0xe8);
                    auVar42._0_12_ = auVar38._0_12_;
                    auVar42._12_2_ = auVar38._6_2_;
                    auVar42._14_2_ = in_XMM1._6_2_;
                    auVar41._12_4_ = auVar42._12_4_;
                    auVar41._0_10_ = auVar38._0_10_;
                    auVar41._10_2_ = in_XMM1._4_2_;
                    auVar40._10_6_ = auVar41._10_6_;
                    auVar40._0_8_ = auVar38._0_8_;
                    auVar40._8_2_ = auVar38._4_2_;
                    auVar39._8_8_ = auVar40._8_8_;
                    auVar39._6_2_ = in_XMM1._2_2_;
                    auVar39._4_2_ = auVar38._2_2_;
                    auVar39._0_2_ = auVar38._0_2_;
                    auVar39._2_2_ = in_XMM1._0_2_;
                    auVar28 = ~auVar39 & auVar28 | auVar36 & auVar39;
                  }
                }
                in_XMM1._0_2_ = -(ushort)(glyph.x_min == auVar28._0_2_);
                sVar31 = -(ushort)(glyph.x_max == auVar28._2_2_);
                sVar32 = -(ushort)(glyph.y_min == auVar28._4_2_);
                sVar33 = -(ushort)(glyph.y_max == auVar28._6_2_);
                in_XMM1._8_8_ =
                     (undefined8)
                     (CONCAT64(CONCAT42(CONCAT22(sVar33,sVar33),sVar32),CONCAT22(sVar32,sVar33)) >>
                     0x10);
                in_XMM1._6_2_ = sVar31;
                in_XMM1._4_2_ = sVar31;
                in_XMM1._2_2_ = in_XMM1._0_2_;
                iVar34 = movmskps((int)pvVar17,in_XMM1);
                if (iVar34 != 0xf) {
LAB_0010da43:
                  anon_unknown_2::GlyfEncoder::WriteBbox(&encoder,local_19c,&glyph);
                }
              }
              uVar18 = 0;
              if (0 < iVar25) {
                uVar18 = uVar16 & 0xffffffff;
              }
              for (lVar26 = 0; uVar18 * 0x18 - lVar26 != 0; lVar26 = lVar26 + 0x18) {
                woff2::Write255UShort
                          ((vector *)&encoder.n_points_stream_,
                           (int)((*(long *)((long)&((glyph.contours.
                                                                                                          
                                                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                           lVar26) -
                                 *(long *)((long)&((glyph.contours.
                                                                                                        
                                                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                          lVar26)) / 0xc));
                in_XMM1._8_8_ = extraout_XMM1_Qb;
                in_XMM1._0_8_ = extraout_XMM1_Qa;
              }
              iVar43 = 0;
              iVar34 = 0;
              for (uVar16 = 0; uVar16 != uVar18; uVar16 = uVar16 + 1) {
                uVar19 = ((long)glyph.contours.
                                super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)glyph.contours.
                               super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16].
                               super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                uVar20 = uVar19 & 0xffffffff;
                if ((int)uVar19 < 1) {
                  uVar20 = 0;
                }
                for (lVar26 = 0; uVar20 * 0xc != lVar26; lVar26 = lVar26 + 0xc) {
                  pPVar22 = glyph.contours.
                            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar16].
                            super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  iVar44 = *(int *)((long)&pPVar22->x + lVar26);
                  iVar3 = *(int *)((long)&pPVar22->y + lVar26);
                  uVar21 = iVar3 - iVar43;
                  uVar24 = iVar44 - iVar34;
                  uVar5 = -uVar24;
                  if (0 < (int)uVar24) {
                    uVar5 = uVar24;
                  }
                  uVar6 = -uVar21;
                  if (0 < (int)uVar21) {
                    uVar6 = uVar21;
                  }
                  local_19d = ((&pPVar22->on_curve)[lVar26] ^ 1U) * -0x80;
                  bVar7 = ~(byte)(uVar21 >> 0x18);
                  bVar27 = (byte)uVar6;
                  if ((iVar44 == iVar34) && (uVar6 < 0x500)) {
                    local_19d = (byte)(uVar6 >> 7) & 0xe | bVar7 >> 7 | local_19d;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    emplace_back<unsigned_char>(&encoder.flag_byte_stream_,&local_19d);
                    local_19d = bVar27;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                  }
                  else {
                    bVar9 = ~(byte)(uVar24 >> 0x18);
                    bVar23 = (byte)uVar5;
                    if ((iVar3 == iVar43) && (uVar5 < 0x500)) {
                      local_19d = ((byte)(uVar5 >> 7) & 0xe | bVar9 >> 7) + local_19d + 10;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      emplace_back<unsigned_char>(&encoder.flag_byte_stream_,&local_19d);
                      local_19d = bVar23;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                    }
                    else {
                      bVar7 = ((char)bVar7 >> 7) * -2 - ((char)bVar9 >> 7);
                      if ((uVar5 < 0x41) && (uVar6 < 0x41)) {
                        local_19d = ((byte)(uVar6 - 1 >> 2) & 0xc) +
                                    local_19d + bVar7 + (bVar23 - 1 & 0x30) + 0x14;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>(&encoder.flag_byte_stream_,&local_19d);
                        local_19d = (byte)(uVar6 - 1) & 0xf | (bVar23 - 1) * '\x10';
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                      }
                      else if ((uVar5 < 0x301) && (uVar6 < 0x301)) {
                        local_19d = (local_19d | bVar7) + ((byte)(uVar6 - 1 >> 6) & 0xc) +
                                    ((byte)(uVar5 - 1 >> 8) & 3) * '\f' + 0x54;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>(&encoder.flag_byte_stream_,&local_19d);
                        local_19d = (byte)(uVar5 - 1);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                        local_19d = (byte)(uVar6 - 1);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                      }
                      else {
                        bVar9 = (byte)(uVar6 >> 8);
                        if ((uVar5 < 0x1000) && (uVar6 < 0x1000)) {
                          local_19d = bVar7 | local_19d | 0x78;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.flag_byte_stream_,&local_19d);
                          local_19d = (byte)(uVar5 >> 4);
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                          local_19d = bVar9 | (byte)(uVar5 << 4);
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                          local_19d = bVar27;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                        }
                        else {
                          local_19d = bVar7 | local_19d | 0x7c;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.flag_byte_stream_,&local_19d);
                          local_19d = (byte)(uVar5 >> 8);
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                          local_19d = bVar23;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                          local_19d = bVar9;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                          local_19d = bVar27;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          emplace_back<unsigned_char>(&encoder.glyph_stream_,&local_19d);
                        }
                      }
                    }
                  }
                  iVar34 = iVar44;
                  iVar43 = iVar3;
                }
              }
              if (0 < iVar25) goto LAB_0010de0d;
            }
          }
          else {
            anon_unknown_2::WriteUShort(&encoder.n_contour_stream_,-1);
            anon_unknown_2::GlyfEncoder::WriteBbox(&encoder,local_19c,&glyph);
            anon_unknown_2::WriteBytes
                      (&encoder.composite_stream_,glyph.composite_data,
                       (ulong)glyph.composite_data_size);
            if (glyph.have_instructions != false) {
LAB_0010de0d:
              anon_unknown_2::GlyfEncoder::WriteInstructions(&encoder,&glyph);
            }
          }
          std::
          vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ::~vector(&glyph.contours);
          iVar25 = local_19c + 1;
        } while( true );
      }
    }
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool TransformGlyfAndLocaTables(Font* font) {
  // no transform for CFF
  const Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  const Font::Table* loca_table = font->FindTable(kLocaTableTag);

  // If you don't have glyf/loca this transform isn't very interesting
  if (loca_table == NULL && glyf_table == NULL) {
    return true;
  }
  // It would be best if you didn't have just one of glyf/loca
  if ((glyf_table == NULL) != (loca_table == NULL)) {
    return FONT_COMPRESSION_FAILURE();
  }
  // Must share neither or both loca & glyf
  if (loca_table->IsReused() != glyf_table->IsReused()) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (loca_table->IsReused()) {
    return true;
  }

  Font::Table* transformed_glyf = &font->tables[kGlyfTableTag ^ 0x80808080];
  Font::Table* transformed_loca = &font->tables[kLocaTableTag ^ 0x80808080];

  int num_glyphs = NumGlyphs(*font);
  GlyfEncoder encoder(num_glyphs);
  for (int i = 0; i < num_glyphs; ++i) {
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }
    encoder.Encode(i, glyph);
  }
  encoder.GetTransformedGlyfBytes(&transformed_glyf->buffer);

  const Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table == NULL || head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }
  transformed_glyf->buffer[7] = head_table->data[51];  // index_format

  transformed_glyf->tag = kGlyfTableTag ^ 0x80808080;
  transformed_glyf->length = transformed_glyf->buffer.size();
  transformed_glyf->data = transformed_glyf->buffer.data();

  transformed_loca->tag = kLocaTableTag ^ 0x80808080;
  transformed_loca->length = 0;
  transformed_loca->data = NULL;

  return true;
}